

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vector.cpp
# Opt level: O2

void __thiscall VECTOR_HORI_VERT::Vector::Vector(Vector *this,string *filename,int N)

{
  string *__rhs;
  char cVar1;
  uint uVar2;
  int *piVar3;
  int *piVar4;
  invalid_argument *this_00;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  int i;
  int iVar10;
  ulong uVar11;
  bool bVar12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  ofstream fil;
  
  this->_vptr_Vector = (_func_int **)&PTR___cxa_pure_virtual_00108cf8;
  __rhs = &this->filename_;
  (this->filename_)._M_dataplus._M_p = (pointer)&(this->filename_).field_2;
  (this->filename_)._M_string_length = 0;
  (this->filename_).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::_M_assign((string *)__rhs);
  std::ofstream::ofstream(&fil);
  std::ofstream::open((char *)&fil,(_Ios_Openmode)(__rhs->_M_dataplus)._M_p);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 == '\0') {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::operator+(&local_270,"Error! Cannot open file ",__rhs);
    std::operator+(&local_250,&local_270,"!\n");
    std::invalid_argument::invalid_argument(this_00,(string *)&local_250);
    __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  std::ofstream::close();
  uVar11 = (ulong)(uint)-N;
  if (0 < N) {
    uVar11 = (ulong)(uint)N;
  }
  this->znak = N >> 0x1f | 1;
  uVar2 = 1;
  uVar9 = 0;
  uVar7 = 0;
  do {
    uVar6 = uVar7;
    uVar2 = uVar2 * 10;
    uVar7 = uVar6 + 1;
    uVar9 = uVar9 + 4;
  } while (uVar2 <= (uint)uVar11);
  this->L = (int)uVar7;
  piVar3 = (int *)operator_new__(uVar9);
  this->vector_ = piVar3;
  for (uVar8 = uVar7; 0 < (long)uVar8; uVar8 = uVar8 - 1) {
    piVar3[uVar8 - 1] = (int)(uVar11 % 10);
    uVar11 = uVar11 / 10;
  }
  uVar8 = 0;
  uVar11 = uVar6;
  while (bVar12 = uVar11 != 0, uVar11 = uVar11 - 1, bVar12) {
    if (0 < piVar3[uVar8]) goto LAB_00104f10;
    uVar8 = uVar8 + 1;
  }
  uVar8 = uVar6 & 0xffffffff;
LAB_00104f10:
  iVar10 = (int)uVar8;
  if (iVar10 != 0) {
    uVar11 = 0xffffffffffffffff;
    if (-1 < (int)uVar7 - iVar10) {
      uVar11 = uVar9 + (long)iVar10 * -4;
    }
    piVar4 = (int *)operator_new__(uVar11);
    for (lVar5 = 0; lVar5 < (long)(uVar7 - (long)iVar10); lVar5 = lVar5 + 1) {
      piVar4[lVar5] = piVar3[(uVar8 & 0xffffffff) + lVar5];
    }
    operator_delete__(piVar3);
    this->vector_ = piVar4;
    this->L = this->L - iVar10;
  }
  std::ofstream::~ofstream(&fil);
  return;
}

Assistant:

Vector::Vector(const std::string& filename, int N) {
    filename_ = filename;
    std::ofstream fil;
    fil.open(filename_.c_str(), std::ios_base::out | std::ios::trunc);
    if (!fil.is_open()) {
      throw std::invalid_argument("Error! Cannot open file " + filename_ + "!\n");
    }
    fil.close();
    if (N>=0){
        this->znak=1;
    }else{
        this->znak=-1;
    }
    N=std::abs(N);
    int tempy=1;
    for (int i=1;;i++){
        tempy*=10;
        if (tempy>N){
            this->L=i;
            break;
        }
    }
    this->vector_=new int[L];
    for(int i=L-1;i>=0;i--){
        this->vector_[i]=N%10;
        N=N/10;
    }
    int j=0;
    for (int i=0; i<L-1; i++){
        if (vector_[i]>0){
            break;
        }else{
            j+=1;
        }
    }
    if (j>0){
        int* vtemp;
        vtemp=new int[L-j];
        for (int i=0;i<L-j;i++){
            vtemp[i]=vector_[i+j];
        }
        delete [] vector_;
        this->vector_=vtemp;
        L=L-j;
    }
  }